

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.h
# Opt level: O0

void __thiscall Connection::onClientDisconnected(Connection *this,SharedPtr *param_1)

{
  enable_shared_from_this<Connection> local_28;
  SharedPtr *local_18;
  SharedPtr *param_1_local;
  Connection *this_local;
  
  this->mIsConnected = false;
  local_18 = param_1;
  param_1_local = (SharedPtr *)this;
  std::enable_shared_from_this<Connection>::shared_from_this(&local_28);
  Signal<std::function<void(std::shared_ptr<Connection>)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<Connection>)>> *)&this->mDisconnected,
             (shared_ptr<Connection> *)&local_28);
  std::shared_ptr<Connection>::~shared_ptr((shared_ptr<Connection> *)&local_28);
  return;
}

Assistant:

void onClientDisconnected(const SocketClient::SharedPtr&) { mIsConnected = false; mDisconnected(shared_from_this()); }